

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O2

int collect_addr_uses(gen_ctx_t gen_ctx,bb_insn_t_conflict bb_insn,VARR_bb_insn_t *bb_mem_insns)

{
  uint uVar1;
  bb_insn_t_conflict obj;
  MIR_insn_t insn;
  int iVar2;
  int iVar3;
  MIR_insn_t insn_00;
  
  insn_00 = bb_insn->insn;
  if (*(int *)&insn_00->field_0x18 - 0x22U < 0xfffffffc) {
    iVar2 = move_p(insn_00);
    if (iVar2 == 0) {
      __assert_fail("MIR_addr_code_p (bb_insn->insn->code) || move_p (bb_insn->insn)",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                    ,0xb15,"int collect_addr_uses(gen_ctx_t, bb_insn_t, VARR_bb_insn_t *)");
    }
  }
  iVar2 = 1;
  while( true ) {
    while( true ) {
      insn_00 = (MIR_insn_t)insn_00->ops[0].data;
      if (insn_00 == (MIR_insn_t)0x0) {
        return iVar2;
      }
      obj = (bb_insn_t_conflict)insn_00->data;
      uVar1 = *(uint *)((long)&(insn_00->insn_link).next + 4);
      insn = obj->insn;
      if (insn->ops[uVar1].field_0x8 == '\v') break;
      iVar3 = move_p(insn);
      if (iVar3 == 0) {
        iVar2 = 0;
      }
      else {
        iVar3 = bitmap_set_bit_p(gen_ctx->temp_bitmap2,(ulong)obj->index);
        if (iVar3 != 0) {
          VARR_bb_insn_tpush(gen_ctx->temp_bb_insns2,(bb_insn_t_conflict)insn_00->data);
        }
      }
    }
    if ((1 < uVar1) || ((*(ulong *)&insn->field_0x18 & 0xfffffffc) != 0)) break;
    if (bb_mem_insns != (VARR_bb_insn_t *)0x0) {
      VARR_bb_insn_tpush(bb_mem_insns,obj);
    }
  }
  __assert_fail("move_code_p (se->use->insn->code) && se->use_op_num <= 1",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                ,0xb18,"int collect_addr_uses(gen_ctx_t, bb_insn_t, VARR_bb_insn_t *)");
}

Assistant:

static int collect_addr_uses (gen_ctx_t gen_ctx, bb_insn_t bb_insn,
                              VARR (bb_insn_t) * bb_mem_insns) {
  int res = TRUE;

  gen_assert (MIR_addr_code_p (bb_insn->insn->code) || move_p (bb_insn->insn));
  for (ssa_edge_t se = bb_insn->insn->ops[0].data; se != NULL; se = se->next_use) {
    if (se->use->insn->ops[se->use_op_num].mode == MIR_OP_VAR_MEM) {
      gen_assert (move_code_p (se->use->insn->code) && se->use_op_num <= 1);
      if (bb_mem_insns != NULL) VARR_PUSH (bb_insn_t, bb_mem_insns, se->use);
      continue;
    }
    if (!move_p (se->use->insn)) {
      res = FALSE;
    } else if (bitmap_set_bit_p (temp_bitmap2, se->use->index)) {
      VARR_PUSH (bb_insn_t, temp_bb_insns2, se->use);
    }
  }
  return res;
}